

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenLine(Lexer *this)

{
  uint uVar1;
  int iVar2;
  Lexer *in_RSI;
  undefined1 local_4a [26];
  
  iVar2 = in_RSI->currentChar;
  nextChar(in_RSI);
  uVar1 = in_RSI->currentChar;
  if ((((int)(char)iVar2 != uVar1) && ((byte)uVar1 < 0xe)) && ((0x2401U >> (uVar1 & 0x1f) & 1) != 0)
     ) {
    nextChar(in_RSI);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&in_RSI->lineIndices,&in_RSI->currentEndIndex);
  local_4a._0_2_ = 1;
  getCurrentCursor((Position *)(local_4a + 2),in_RSI);
  std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
            ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)local_4a);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenLine() noexcept {
  char c = currentChar;
  nextChar(); // eat newline char

  // eat again if newline character (but not equal to the previous one)
  if (c != currentChar && _isNewLineCharacter(currentChar))
    nextChar();

  lineIndices.push_back(currentEndIndex);
  return std::make_unique<Token>(currentToken, TokenType::TOK_EOL, getCurrentCursor());
}